

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

int XMLSearch_search_set_children_search(XMLSearch *search,XMLSearch *children_search)

{
  if (search != (XMLSearch *)0x0) {
    if (search->next != (XMLSearch *)0x0) {
      XMLSearch_free(search->next,1);
    }
    search->next = children_search;
    children_search->prev = search;
    return 1;
  }
  return 0;
}

Assistant:

int XMLSearch_search_set_children_search(XMLSearch* search, XMLSearch* children_search)
{
	if (search == NULL)
		return FALSE;

	if (search->next != NULL)
		XMLSearch_free(search->next, TRUE);

	search->next = children_search;
	children_search->prev = search;

	return TRUE;
}